

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O3

format_arg * __thiscall
fmt::v5::
basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
::do_get(format_arg *__return_storage_ptr__,
        basic_format_args<fmt::v5::basic_format_context<std::back_insert_iterator<fmt::v5::internal::basic_buffer<wchar_t>_>,_wchar_t>_>
        *this,size_type index)

{
  longlong *plVar1;
  size_t sVar2;
  format_arg *pfVar3;
  long lVar4;
  ulong uVar5;
  
  (__return_storage_ptr__->value_).field_0.int_value = 0;
  __return_storage_ptr__->type_ = none_type;
  uVar5 = this->types_;
  if ((long)uVar5 < 0) {
    if ((uint)uVar5 <= index) {
      return __return_storage_ptr__;
    }
    pfVar3 = (this->field_1).args_;
    lVar4 = (ulong)index * 0x20;
    __return_storage_ptr__->type_ = pfVar3[index].type_;
  }
  else {
    if (0xf < index) {
      return __return_storage_ptr__;
    }
    uVar5 = uVar5 >> ((char)index * '\x04' & 0x3fU);
    __return_storage_ptr__->type_ = (type)uVar5 & (pointer_type|uint_type);
    if ((uVar5 & 0xf) == 0) {
      return __return_storage_ptr__;
    }
    pfVar3 = (format_arg *)(this->field_1).values_;
    lVar4 = (ulong)index << 4;
  }
  plVar1 = (longlong *)((long)&(pfVar3->value_).field_0 + lVar4);
  sVar2 = plVar1[1];
  (__return_storage_ptr__->value_).field_0.long_long_value = *plVar1;
  (__return_storage_ptr__->value_).field_0.string.size = sVar2;
  return __return_storage_ptr__;
}

Assistant:

format_arg do_get(size_type index) const {
    format_arg arg;
    if (!is_packed()) {
      auto num_args = max_size();
      if (index < num_args)
        arg = args_[index];
      return arg;
    }
    if (index > internal::max_packed_args)
      return arg;
    arg.type_ = type(index);
    if (arg.type_ == internal::none_type)
      return arg;
    internal::value<Context> &val = arg.value_;
    val = values_[index];
    return arg;
  }